

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O2

int onig_codes_byte_at(OnigCodePoint *codes,int at)

{
  return codes[at / 3] >> (0x10U - (char)(at % 3 << 3) & 0x1f) & 0xff;
}

Assistant:

extern int
onig_codes_byte_at(OnigCodePoint codes[], int at)
{
  int index;
  int b;
  OnigCodePoint code;

  index = at / 3;
  b     = at % 3;
  code = codes[index];

  return ((code >> ((2 - b) * 8)) & 0xff);
}